

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall cmMakefile::IsDefinitionSet(cmMakefile *this,string *name)

{
  cmake *pcVar1;
  cmVariableWatch *this_00;
  bool bVar2;
  cmValue l;
  
  l = cmStateSnapshot::GetDefinition(&this->StateSnapshot,name);
  if (l.Value == (string *)0x0) {
    l = cmState::GetInitializedCacheValue
                  ((this->GlobalGenerator->CMakeInstance->State)._M_t.
                   super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                   super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                   super__Head_base<0UL,_cmState_*,_false>._M_head_impl,name);
  }
  pcVar1 = this->GlobalGenerator->CMakeInstance;
  if (((pcVar1 != (cmake *)0x0) &&
      (this_00 = (pcVar1->VariableWatch)._M_t.
                 super___uniq_ptr_impl<cmVariableWatch,_std::default_delete<cmVariableWatch>_>._M_t.
                 super__Tuple_impl<0UL,_cmVariableWatch_*,_std::default_delete<cmVariableWatch>_>.
                 super__Head_base<0UL,_cmVariableWatch_*,_false>._M_head_impl,
      this_00 != (cmVariableWatch *)0x0)) && (l.Value == (string *)0x0)) {
    cmVariableWatch::VariableAccessed(this_00,name,2,(char *)0x0,this);
  }
  bVar2 = ::operator!=(l,(nullptr_t)0x0);
  return bVar2;
}

Assistant:

bool cmMakefile::IsDefinitionSet(const std::string& name) const
{
  cmValue def = this->StateSnapshot.GetDefinition(name);
  if (!def) {
    def = this->GetState()->GetInitializedCacheValue(name);
  }
#ifndef CMAKE_BOOTSTRAP
  if (cmVariableWatch* vv = this->GetVariableWatch()) {
    if (!def) {
      vv->VariableAccessed(
        name, cmVariableWatch::UNKNOWN_VARIABLE_DEFINED_ACCESS, nullptr, this);
    }
  }
#endif
  return def != nullptr;
}